

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O3

void __thiscall
irr::core::array<irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute>::push_back
          (array<irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute> *this,
          SAttribute *element)

{
  uint uVar1;
  SAttribute *pSVar2;
  string<char> local_40;
  string<char> local_30;
  
  uVar1 = this->used;
  if (this->allocated < uVar1 + 1) {
    local_40.allocated = 1;
    local_40.used = 1;
    local_40.array = (char *)operator_new__(1);
    *local_40.array = '\0';
    local_30.allocated = 1;
    local_30.used = 1;
    local_30.array = (char *)operator_new__(1);
    *local_30.array = '\0';
    string<char>::operator=(&local_40,&element->Name);
    string<char>::operator=(&local_30,&element->Value);
    reallocate(this,this->used * 2 + 1);
    uVar1 = this->used;
    this->used = uVar1 + 1;
    pSVar2 = this->data;
    string<char>::operator=(&pSVar2[uVar1].Name,&local_40);
    string<char>::operator=(&pSVar2[uVar1].Value,&local_30);
    this->is_sorted = false;
    if (local_30.array != (char *)0x0) {
      operator_delete__(local_30.array);
    }
    if (local_40.array != (char *)0x0) {
      operator_delete__(local_40.array);
    }
  }
  else {
    pSVar2 = this->data;
    this->used = uVar1 + 1;
    string<char>::operator=(&pSVar2[uVar1].Name,&element->Name);
    string<char>::operator=(&pSVar2[uVar1].Value,&element->Value);
    this->is_sorted = false;
  }
  return;
}

Assistant:

void push_back(const T& element)
	{
		if (used + 1 > allocated)
		{
			// reallocate(used * 2 +1);
			// this doesn't work if the element is in the same array. So
			// we'll copy the element first to be sure we'll get no data
			// corruption

			T e;
			e = element;           // copy element
			reallocate(used * 2 +1); // increase data block
			data[used++] = e;        // push_back
			is_sorted = false; 
			return;
		}

		data[used++] = element;
		is_sorted = false;
	}